

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optim_mir.cpp
# Opt level: O0

map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
* build_dom_tree(map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *dom)

{
  bool bVar1;
  _Setw _Var2;
  ostream *poVar3;
  pointer ppVar4;
  ulong uVar5;
  size_type sVar6;
  reference pvVar7;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>,_bool>
  pVar8;
  int i;
  iterator it;
  vector<int,_std::allocator<int>_> v_1;
  vector<int,_std::allocator<int>_> v;
  iterator dtr;
  iterator tr;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *dom_tree;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *in_stack_fffffffffffffe88;
  pair<const_int,_std::vector<int,_std::allocator<int>_>_> *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffe98;
  _Setw in_stack_fffffffffffffe9c;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *in_stack_fffffffffffffea0;
  key_type *in_stack_fffffffffffffec8;
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  *in_stack_fffffffffffffed0;
  mapped_type *in_stack_fffffffffffffed8;
  undefined7 in_stack_fffffffffffffee0;
  undefined1 in_stack_fffffffffffffee7;
  undefined4 in_stack_ffffffffffffff28;
  int iVar9;
  undefined4 in_stack_ffffffffffffff2c;
  _Self in_stack_ffffffffffffff30;
  _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> local_c0;
  _Base_ptr local_b8;
  _Base_ptr local_98;
  undefined1 local_90;
  _Self local_50 [3];
  _Self local_38;
  _Self local_30;
  _Base_ptr local_28;
  _Rb_tree_iterator<std::pair<const_int,_int>_> local_20;
  undefined1 local_11;
  
  local_11 = 0;
  std::
  map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
  ::map((map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
         *)0x28350c);
  std::_Rb_tree_iterator<std::pair<const_int,_int>_>::_Rb_tree_iterator(&local_20);
  local_28 = (_Base_ptr)
             std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::begin
                       ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>
                         *)in_stack_fffffffffffffe88);
  local_20._M_node = local_28;
  while( true ) {
    local_30._M_node =
         (_Base_ptr)
         std::map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_>::end
                   ((map<int,_int,_std::less<int>,_std::allocator<std::pair<const_int,_int>_>_> *)
                    in_stack_fffffffffffffe88);
    bVar1 = std::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
              ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)0x28357e);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
         ::find(in_stack_fffffffffffffe88,(key_type *)0x28358f);
    local_50[0]._M_node =
         (_Base_ptr)
         std::
         map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
         ::end(in_stack_fffffffffffffe88);
    bVar1 = std::operator==(&local_38,local_50);
    if (bVar1) {
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x2835e5);
      std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)0x2835f2);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea0,
                 (value_type_conflict3 *)
                 CONCAT44(in_stack_fffffffffffffe9c._M_n,in_stack_fffffffffffffe98));
      std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)0x28360e);
      std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::
      pair<int_&,_std::vector<int,_std::allocator<int>_>_&,_true>
                (in_stack_fffffffffffffe90,(int *)in_stack_fffffffffffffe88,
                 (vector<int,_std::allocator<int>_> *)0x28362a);
      pVar8 = std::
              map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
              ::insert(in_stack_fffffffffffffea0,
                       (value_type *)
                       CONCAT44(in_stack_fffffffffffffe9c._M_n,in_stack_fffffffffffffe98));
      local_98 = (_Base_ptr)pVar8.first._M_node;
      in_stack_fffffffffffffee7 = pVar8.second;
      local_90 = in_stack_fffffffffffffee7;
      std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>::~pair
                ((pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)0x28366e);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea0);
    }
    else {
      std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
      operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                  *)0x2836ef);
      std::vector<int,_std::allocator<int>_>::vector
                ((vector<int,_std::allocator<int>_> *)
                 CONCAT17(in_stack_fffffffffffffee7,in_stack_fffffffffffffee0),
                 in_stack_fffffffffffffed8);
      std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)0x283712);
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea0,
                 (value_type_conflict3 *)
                 CONCAT44(in_stack_fffffffffffffe9c._M_n,in_stack_fffffffffffffe98));
      std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator->
                ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)0x283731);
      in_stack_fffffffffffffed8 =
           std::
           map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
           ::operator[](in_stack_fffffffffffffed0,in_stack_fffffffffffffec8);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffff30._M_node,
                 (vector<int,_std::allocator<int>_> *)
                 CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffea0);
    }
    local_b8 = (_Base_ptr)
               std::_Rb_tree_iterator<std::pair<const_int,_int>_>::operator++
                         ((_Rb_tree_iterator<std::pair<const_int,_int>_> *)
                          CONCAT44(in_stack_fffffffffffffe9c._M_n,in_stack_fffffffffffffe98),
                          (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
  }
  poVar3 = (ostream *)std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
  poVar3 = std::operator<<(poVar3,"*** desplay dominator tree ***");
  std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
  std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
  _Rb_tree_iterator(&local_c0);
  local_c0._M_node =
       (_Base_ptr)
       std::
       map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
       ::begin(in_stack_fffffffffffffe88);
  while( true ) {
    std::
    map<int,_std::vector<int,_std::allocator<int>_>,_std::less<int>,_std::allocator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>_>
    ::end(in_stack_fffffffffffffe88);
    bVar1 = std::operator!=(&local_c0,(_Self *)&stack0xffffffffffffff30);
    if (!bVar1) break;
    _Var2 = std::setw(7);
    poVar3 = std::operator<<((ostream *)&std::cout,_Var2);
    ppVar4 = std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                           *)0x283896);
    poVar3 = (ostream *)std::ostream::operator<<(poVar3,ppVar4->first);
    std::operator<<(poVar3," child(s):");
    iVar9 = 0;
    while( true ) {
      uVar5 = (ulong)iVar9;
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
               operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                           *)0x2838e1);
      sVar6 = std::vector<int,_std::allocator<int>_>::size(&ppVar4->second);
      if (sVar6 <= uVar5) break;
      poVar3 = std::operator<<((ostream *)&std::cout," ");
      in_stack_fffffffffffffe9c = std::setw(7);
      in_stack_fffffffffffffe90 =
           (pair<const_int,_std::vector<int,_std::allocator<int>_>_> *)
           std::operator<<(poVar3,in_stack_fffffffffffffe9c);
      ppVar4 = std::
               _Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
               operator->((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>
                           *)0x283958);
      pvVar7 = std::vector<int,_std::allocator<int>_>::operator[](&ppVar4->second,(long)iVar9);
      std::ostream::operator<<(in_stack_fffffffffffffe90,*pvVar7);
      iVar9 = iVar9 + 1;
    }
    std::ostream::operator<<(&std::cout,std::endl<char,std::char_traits<char>>);
    std::_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_>::
    operator++((_Rb_tree_iterator<std::pair<const_int,_std::vector<int,_std::allocator<int>_>_>_> *)
               CONCAT44(in_stack_fffffffffffffe9c._M_n,in_stack_fffffffffffffe98),
               (int)((ulong)in_stack_fffffffffffffe90 >> 0x20));
  }
  return in_RDI;
}

Assistant:

map<int, vector<int>> build_dom_tree(map<int, int> dom) {
  map<int, vector<int>> dom_tree;
  map<int, int>::iterator tr;
  for (tr = dom.begin(); tr != dom.end(); tr++) {
    map<int, vector<int>>::iterator dtr = dom_tree.find(tr->second);
    if (dtr == dom_tree.end()) {
      vector<int> v;
      v.push_back(tr->first);
      dom_tree.insert(map<int, vector<int>>::value_type(tr->second, v));
    } else {
      vector<int> v = dtr->second;
      v.push_back(tr->first);
      dom_tree[tr->second] = v;
    }
  }
  cout << endl << "*** desplay dominator tree ***" << endl;
  map<int, vector<int>>::iterator it;
  for (it = dom_tree.begin(); it != dom_tree.end(); it++) {
    cout << setw(7) << it->first << " child(s):";
    for (int i = 0; i < it->second.size(); i++) {
      cout << " " << setw(7) << it->second[i];
    }
    cout << endl;
  }
  return dom_tree;
}